

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  size_t *psVar13;
  undefined1 (*pauVar14) [64];
  long lVar15;
  int iVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [32];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 (*pauVar24) [64];
  undefined1 (*pauVar25) [16];
  long lVar26;
  undefined4 *puVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  
  iVar1 = A->elempack;
  psVar13 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar13 = &A->cstep;
  }
  iVar2 = (int)*psVar13;
  pauVar14 = (undefined1 (*) [64])AT->data;
  uVar17 = 0;
  lVar19 = (long)iVar2;
  lVar28 = (long)i;
  if (0xf < max_ii) {
    lVar23 = (long)(iVar2 * k);
    lVar20 = lVar28 * 0x40 + lVar23 * 4 + 0x3c0;
    lVar15 = lVar28 * 0x20 + lVar23 * 4 + 0x1e0;
    lVar21 = lVar28 * 0x10 + lVar23 * 4 + 0xf0;
    lVar23 = lVar23 * 4 + lVar28 * 4;
    uVar30 = 0;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar20);
        iVar16 = 0xf;
        do {
          auVar54 = vunpcklps_avx512f(pauVar24[-0xf],pauVar24[-0xe]);
          auVar55 = vunpckhps_avx512f(pauVar24[-0xf],pauVar24[-0xe]);
          auVar56 = vunpcklps_avx512f(pauVar24[-0xd],pauVar24[-0xc]);
          auVar57 = vunpckhps_avx512f(pauVar24[-0xd],pauVar24[-0xc]);
          auVar58 = vunpcklps_avx512f(pauVar24[-0xb],pauVar24[-10]);
          auVar59 = vunpckhps_avx512f(pauVar24[-0xb],pauVar24[-10]);
          auVar60 = vunpcklps_avx512f(pauVar24[-9],pauVar24[-8]);
          auVar61 = vunpckhps_avx512f(pauVar24[-9],pauVar24[-8]);
          auVar62 = vunpcklps_avx512f(pauVar24[-7],pauVar24[-6]);
          auVar63 = vunpckhps_avx512f(pauVar24[-7],pauVar24[-6]);
          auVar64 = vunpcklps_avx512f(pauVar24[-5],pauVar24[-4]);
          auVar65 = vunpckhps_avx512f(pauVar24[-5],pauVar24[-4]);
          auVar66 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar67 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar68 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
          auVar69 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
          auVar70 = vunpcklpd_avx512f(auVar54,auVar56);
          auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
          auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
          auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
          auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
          auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
          auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
          auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
          auVar61 = vunpcklpd_avx512f(auVar62,auVar64);
          auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
          auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
          auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
          auVar65 = vunpcklpd_avx512f(auVar66,auVar68);
          auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
          auVar68 = vunpcklpd_avx512f(auVar67,auVar69);
          auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
          auVar69 = vshuff64x2_avx512f(auVar70,auVar57,0x88);
          auVar71 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
          auVar72 = vshuff64x2_avx512f(auVar54,auVar58,0x88);
          auVar73 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
          auVar74 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
          auVar75 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
          auVar76 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
          auVar77 = vshuff64x2_avx512f(auVar63,auVar67,0x88);
          auVar57 = vshuff64x2_avx512f(auVar70,auVar57,0xdd);
          auVar61 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
          auVar54 = vshuff64x2_avx512f(auVar54,auVar58,0xdd);
          auVar58 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
          auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
          auVar60 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
          auVar59 = vshuff64x2_avx512f(auVar63,auVar67,0xdd);
          auVar62 = vshuff64x2_avx512f(auVar69,auVar71,0x88);
          auVar63 = vshuff64x2_avx512f(auVar72,auVar73,0x88);
          auVar64 = vshuff64x2_avx512f(auVar74,auVar75,0x88);
          auVar65 = vshuff64x2_avx512f(auVar76,auVar77,0x88);
          auVar66 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
          auVar67 = vshuff64x2_avx512f(auVar54,auVar58,0x88);
          auVar68 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
          auVar70 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
          auVar69 = vshuff64x2_avx512f(auVar69,auVar71,0xdd);
          auVar71 = vshuff64x2_avx512f(auVar72,auVar73,0xdd);
          auVar72 = vshuff64x2_avx512f(auVar74,auVar75,0xdd);
          auVar73 = vshuff64x2_avx512f(auVar76,auVar77,0xdd);
          auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
          auVar54 = vshuff64x2_avx512f(auVar54,auVar58,0xdd);
          auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
          *pauVar14 = auVar62;
          pauVar14[1] = auVar63;
          pauVar14[2] = auVar64;
          pauVar14[3] = auVar65;
          pauVar14[4] = auVar66;
          pauVar14[5] = auVar67;
          pauVar14[6] = auVar68;
          pauVar14[7] = auVar70;
          pauVar14[8] = auVar69;
          pauVar14[9] = auVar71;
          pauVar14[10] = auVar72;
          pauVar14[0xb] = auVar73;
          pauVar14[0xc] = auVar57;
          pauVar14[0xd] = auVar54;
          pauVar14[0xe] = auVar56;
          pauVar14[0xf] = auVar55;
          pauVar14 = pauVar14 + 0x10;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar2 << 4) * 4);
          iVar16 = iVar16 + 0x10;
        } while (iVar16 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar15);
        iVar16 = 7;
        do {
          auVar44 = vunpcklps_avx512vl(pauVar18[-0xf],pauVar18[-0xe]);
          auVar5 = vunpckhps_avx(pauVar18[-0xf],pauVar18[-0xe]);
          auVar11 = vunpcklps_avx(pauVar18[-0xd],pauVar18[-0xc]);
          auVar6 = vunpckhps_avx(pauVar18[-0xd],pauVar18[-0xc]);
          auVar81 = vunpcklps_avx(pauVar18[-0xb],pauVar18[-10]);
          auVar79 = vunpckhps_avx(pauVar18[-0xb],pauVar18[-10]);
          auVar82 = vunpcklps_avx(pauVar18[-9],pauVar18[-8]);
          auVar78 = vunpckhps_avx(pauVar18[-9],pauVar18[-8]);
          auVar83 = vunpcklps_avx(pauVar18[-7],pauVar18[-6]);
          auVar7 = vunpckhps_avx(pauVar18[-7],pauVar18[-6]);
          auVar84 = vunpcklps_avx(pauVar18[-5],pauVar18[-4]);
          auVar80 = vunpckhps_avx(pauVar18[-5],pauVar18[-4]);
          auVar12 = vunpcklps_avx(pauVar18[-3],pauVar18[-2]);
          auVar8 = vunpckhps_avx(pauVar18[-3],pauVar18[-2]);
          auVar48 = vunpcklps_avx(pauVar18[-1],*pauVar18);
          auVar47 = vunpckhps_avx(pauVar18[-1],*pauVar18);
          auVar45 = vunpcklpd_avx512vl(auVar44,auVar11);
          auVar44 = vunpckhpd_avx512vl(auVar44,auVar11);
          auVar46 = vunpcklpd_avx512vl(auVar5,auVar6);
          auVar5 = vunpckhpd_avx(auVar5,auVar6);
          auVar11 = vunpcklpd_avx(auVar81,auVar82);
          auVar6 = vunpckhpd_avx(auVar81,auVar82);
          auVar81 = vunpcklpd_avx(auVar79,auVar78);
          auVar79 = vunpckhpd_avx(auVar79,auVar78);
          auVar82 = vunpcklpd_avx(auVar83,auVar84);
          auVar78 = vunpckhpd_avx(auVar83,auVar84);
          auVar83 = vunpcklpd_avx(auVar7,auVar80);
          auVar7 = vunpckhpd_avx(auVar7,auVar80);
          auVar84 = vunpcklpd_avx(auVar12,auVar48);
          auVar80 = vunpckhpd_avx(auVar12,auVar48);
          auVar12 = vunpcklpd_avx(auVar8,auVar47);
          auVar8 = vunpckhpd_avx(auVar8,auVar47);
          auVar47 = vinsertf32x4_avx512vl(auVar82,auVar84._0_16_,1);
          auVar48 = vinsertf32x4_avx512vl(auVar44,auVar6._0_16_,1);
          auVar49 = vinsertf32x4_avx512vl(auVar78,auVar80._0_16_,1);
          auVar50 = vinsertf32x4_avx512vl(auVar46,auVar81._0_16_,1);
          auVar51 = vinsertf32x4_avx512vl(auVar83,auVar12._0_16_,1);
          auVar52 = vinsertf32x4_avx512vl(auVar5,auVar79._0_16_,1);
          auVar53 = vinsertf32x4_avx512vl(auVar7,auVar8._0_16_,1);
          auVar54 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(auVar11._0_16_,auVar45._0_16_)),auVar47,1);
          auVar55 = vinsertf64x4_avx512f(ZEXT3264(auVar48),auVar49,1);
          auVar56 = vinsertf64x4_avx512f(ZEXT3264(auVar50),auVar51,1);
          auVar57 = vinsertf64x4_avx512f(ZEXT3264(auVar52),auVar53,1);
          auVar58 = vinsertf64x4_avx512f(ZEXT3264(auVar82),auVar84,1);
          auVar59 = vinsertf64x4_avx512f(ZEXT3264(auVar45),auVar11,1);
          auVar58 = vshuff64x2_avx512f(auVar59,auVar58,0xdd);
          auVar59 = vinsertf64x4_avx512f(ZEXT3264(auVar78),auVar80,1);
          auVar60 = vinsertf64x4_avx512f(ZEXT3264(auVar44),auVar6,1);
          auVar59 = vshuff64x2_avx512f(auVar60,auVar59,0xdd);
          auVar60 = vinsertf64x4_avx512f(ZEXT3264(auVar83),auVar12,1);
          auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar46),auVar81,1);
          auVar60 = vshuff64x2_avx512f(auVar61,auVar60,0xdd);
          auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar7),auVar8,1);
          auVar62 = vinsertf64x4_avx512f(ZEXT3264(auVar5),auVar79,1);
          auVar61 = vshuff64x2_avx512f(auVar62,auVar61,0xdd);
          *pauVar14 = auVar54;
          pauVar14[1] = auVar55;
          pauVar14[2] = auVar56;
          pauVar14[3] = auVar57;
          pauVar14[4] = auVar58;
          pauVar14[5] = auVar59;
          pauVar14[6] = auVar60;
          pauVar14[7] = auVar61;
          pauVar14 = pauVar14 + 8;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar2 * 8) * 4);
          iVar16 = iVar16 + 8;
        } while (iVar16 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar21);
        iVar16 = 3;
        do {
          auVar31 = vunpcklps_avx512vl(pauVar25[-0xf],pauVar25[-0xe]);
          auVar32 = vunpcklps_avx512vl(pauVar25[-0xd],pauVar25[-0xc]);
          auVar3 = vunpckhps_avx(pauVar25[-0xf],pauVar25[-0xe]);
          auVar4 = vunpckhps_avx(pauVar25[-0xd],pauVar25[-0xc]);
          auVar33 = vunpcklpd_avx512vl(auVar31,auVar32);
          auVar34 = vunpckhpd_avx512vl(auVar31,auVar32);
          auVar35 = vunpcklpd_avx512vl(auVar3,auVar4);
          auVar3 = vunpckhpd_avx(auVar3,auVar4);
          auVar32 = vunpcklps_avx(pauVar25[-0xb],pauVar25[-10]);
          auVar36 = vunpcklps_avx512vl(pauVar25[-9],pauVar25[-8]);
          auVar4 = vunpckhps_avx(pauVar25[-0xb],pauVar25[-10]);
          auVar31 = vunpckhps_avx(pauVar25[-9],pauVar25[-8]);
          auVar37 = vunpcklpd_avx512vl(auVar32,auVar36);
          auVar38 = vunpckhpd_avx512vl(auVar32,auVar36);
          auVar9 = vunpcklpd_avx(auVar4,auVar31);
          auVar4 = vunpckhpd_avx(auVar4,auVar31);
          auVar36 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
          auVar39 = vunpcklps_avx512vl(pauVar25[-5],pauVar25[-4]);
          auVar31 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
          auVar32 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
          auVar40 = vunpcklpd_avx512vl(auVar36,auVar39);
          auVar41 = vunpckhpd_avx512vl(auVar36,auVar39);
          auVar39 = vunpcklpd_avx(auVar31,auVar32);
          auVar31 = vunpckhpd_avx(auVar31,auVar32);
          auVar10 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar42 = vunpcklps_avx512vl(pauVar25[-1],*pauVar25);
          auVar32 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar36 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar43 = vunpcklpd_avx512vl(auVar10,auVar42);
          auVar42 = vunpckhpd_avx512vl(auVar10,auVar42);
          auVar10 = vunpcklpd_avx(auVar32,auVar36);
          auVar32 = vunpckhpd_avx(auVar32,auVar36);
          *(undefined1 (*) [16])*pauVar14 = auVar33;
          *(undefined1 (*) [16])(*pauVar14 + 0x10) = auVar37;
          *(undefined1 (*) [16])(*pauVar14 + 0x20) = auVar40;
          *(undefined1 (*) [16])(*pauVar14 + 0x30) = auVar43;
          *(undefined1 (*) [16])pauVar14[1] = auVar34;
          *(undefined1 (*) [16])(pauVar14[1] + 0x10) = auVar38;
          *(undefined1 (*) [16])(pauVar14[1] + 0x20) = auVar41;
          *(undefined1 (*) [16])(pauVar14[1] + 0x30) = auVar42;
          *(undefined1 (*) [16])pauVar14[2] = auVar35;
          *(undefined1 (*) [16])(pauVar14[2] + 0x10) = auVar9;
          *(undefined1 (*) [16])(pauVar14[2] + 0x20) = auVar39;
          *(undefined1 (*) [16])(pauVar14[2] + 0x30) = auVar10;
          *(undefined1 (*) [16])pauVar14[3] = auVar3;
          *(undefined1 (*) [16])(pauVar14[3] + 0x10) = auVar4;
          *(undefined1 (*) [16])(pauVar14[3] + 0x20) = auVar31;
          *(undefined1 (*) [16])(pauVar14[3] + 0x30) = auVar32;
          pauVar14 = pauVar14 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
          iVar16 = iVar16 + 4;
        } while (iVar16 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar23);
        iVar16 = max_kk;
        do {
          *pauVar14 = *pauVar24;
          pauVar14 = pauVar14 + 1;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar19 * 4);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar17 = uVar30 + 0x10;
      uVar29 = uVar30 + 0x1f;
      lVar20 = lVar20 + 0x400;
      lVar15 = lVar15 + 0x200;
      lVar21 = lVar21 + 0x100;
      lVar23 = lVar23 + 0x40;
      uVar30 = uVar17;
    } while (uVar29 < (uint)max_ii);
  }
  lVar23 = (long)max_ii;
  if ((int)((uint)uVar17 | 7) < max_ii) {
    lVar20 = (long)(iVar2 * k);
    uVar30 = uVar17 & 0xffffffff;
    lVar15 = lVar28 + uVar30;
    lVar22 = lVar15 * 0x40 + lVar20 * 4 + 0x1c0;
    lVar26 = lVar15 * 0x20 + lVar20 * 4 + 0xe0;
    lVar21 = lVar15 * 0x10 + lVar20 * 4 + 0x70;
    lVar15 = lVar28 * 4 + lVar20 * 4 + uVar30 * 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar22);
        iVar16 = 0xf;
        do {
          auVar54 = vunpcklps_avx512f(pauVar24[-7],pauVar24[-6]);
          auVar55 = vunpckhps_avx512f(pauVar24[-7],pauVar24[-6]);
          auVar56 = vunpcklps_avx512f(pauVar24[-5],pauVar24[-4]);
          auVar57 = vunpckhps_avx512f(pauVar24[-5],pauVar24[-4]);
          auVar58 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar59 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar60 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
          auVar61 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
          auVar62 = vunpcklpd_avx512f(auVar54,auVar56);
          auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
          auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
          auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
          auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
          auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
          auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
          auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
          auVar61 = vshuff64x2_avx512f(auVar62,auVar57,0x88);
          auVar63 = vshuff64x2_avx512f(auVar54,auVar58,0x88);
          auVar64 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
          auVar65 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
          auVar57 = vshuff64x2_avx512f(auVar62,auVar57,0xdd);
          auVar54 = vshuff64x2_avx512f(auVar54,auVar58,0xdd);
          auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
          auVar58 = vshuff64x2_avx512f(auVar61,auVar63,0x88);
          auVar59 = vshuff64x2_avx512f(auVar64,auVar65,0x88);
          auVar60 = vshuff64x2_avx512f(auVar57,auVar54,0x88);
          auVar62 = vshuff64x2_avx512f(auVar56,auVar55,0x88);
          auVar61 = vshuff64x2_avx512f(auVar61,auVar63,0xdd);
          auVar63 = vshuff64x2_avx512f(auVar64,auVar65,0xdd);
          auVar54 = vshuff64x2_avx512f(auVar57,auVar54,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar56,auVar55,0xdd);
          *pauVar14 = auVar58;
          pauVar14[1] = auVar59;
          pauVar14[2] = auVar60;
          pauVar14[3] = auVar62;
          pauVar14[4] = auVar61;
          pauVar14[5] = auVar63;
          pauVar14[6] = auVar54;
          pauVar14[7] = auVar55;
          pauVar14 = pauVar14 + 8;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar2 << 4) * 4);
          iVar16 = iVar16 + 0x10;
        } while (iVar16 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar26);
        iVar16 = 7;
        do {
          auVar5 = vunpcklps_avx(pauVar18[-7],pauVar18[-6]);
          auVar6 = vunpckhps_avx(pauVar18[-7],pauVar18[-6]);
          auVar8 = vunpcklps_avx(pauVar18[-5],pauVar18[-4]);
          auVar79 = vunpckhps_avx(pauVar18[-5],pauVar18[-4]);
          auVar11 = vunpcklps_avx(pauVar18[-3],pauVar18[-2]);
          auVar78 = vunpckhps_avx(pauVar18[-3],pauVar18[-2]);
          auVar81 = vunpcklps_avx(pauVar18[-1],*pauVar18);
          auVar7 = vunpckhps_avx(pauVar18[-1],*pauVar18);
          auVar80 = vunpcklpd_avx(auVar5,auVar8);
          auVar5 = vunpckhpd_avx(auVar5,auVar8);
          auVar8 = vunpcklpd_avx(auVar6,auVar79);
          auVar6 = vunpckhpd_avx(auVar6,auVar79);
          auVar47 = vunpcklpd_avx(auVar11,auVar81);
          auVar79 = vunpckhpd_avx(auVar11,auVar81);
          auVar11 = vunpcklpd_avx(auVar78,auVar7);
          auVar78 = vunpckhpd_avx(auVar78,auVar7);
          auVar81._16_16_ = auVar47._0_16_;
          auVar81._0_16_ = auVar80._0_16_;
          auVar82._16_16_ = auVar79._0_16_;
          auVar82._0_16_ = auVar5._0_16_;
          auVar83._16_16_ = auVar11._0_16_;
          auVar83._0_16_ = auVar8._0_16_;
          auVar84._16_16_ = auVar78._0_16_;
          auVar84._0_16_ = auVar6._0_16_;
          auVar7 = vperm2f128_avx(auVar80,auVar47,0x31);
          auVar5 = vperm2f128_avx(auVar5,auVar79,0x31);
          auVar79 = vperm2f128_avx(auVar8,auVar11,0x31);
          auVar6 = vperm2f128_avx(auVar6,auVar78,0x31);
          *(undefined1 (*) [32])*pauVar14 = auVar81;
          *(undefined1 (*) [32])(*pauVar14 + 0x20) = auVar82;
          *(undefined1 (*) [32])pauVar14[1] = auVar83;
          *(undefined1 (*) [32])(pauVar14[1] + 0x20) = auVar84;
          *(undefined1 (*) [32])pauVar14[2] = auVar7;
          *(undefined1 (*) [32])(pauVar14[2] + 0x20) = auVar5;
          *(undefined1 (*) [32])pauVar14[3] = auVar79;
          *(undefined1 (*) [32])(pauVar14[3] + 0x20) = auVar6;
          pauVar14 = pauVar14 + 4;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar2 * 8) * 4);
          iVar16 = iVar16 + 8;
        } while (iVar16 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar21);
        iVar16 = 3;
        do {
          auVar3 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
          auVar32 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
          auVar4 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
          auVar31 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
          auVar9 = vunpcklpd_avx(auVar3,auVar32);
          auVar3 = vunpckhpd_avx(auVar3,auVar32);
          auVar39 = vunpcklpd_avx(auVar4,auVar31);
          auVar4 = vunpckhpd_avx(auVar4,auVar31);
          auVar31 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar33 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar32 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar36 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar10 = vunpcklpd_avx(auVar31,auVar33);
          auVar31 = vunpckhpd_avx(auVar31,auVar33);
          auVar33 = vunpcklpd_avx(auVar32,auVar36);
          auVar32 = vunpckhpd_avx(auVar32,auVar36);
          *(undefined1 (*) [16])*pauVar14 = auVar9;
          *(undefined1 (*) [16])(*pauVar14 + 0x10) = auVar10;
          *(undefined1 (*) [16])(*pauVar14 + 0x20) = auVar3;
          *(undefined1 (*) [16])(*pauVar14 + 0x30) = auVar31;
          *(undefined1 (*) [16])pauVar14[1] = auVar39;
          *(undefined1 (*) [16])(pauVar14[1] + 0x10) = auVar33;
          *(undefined1 (*) [16])(pauVar14[1] + 0x20) = auVar4;
          *(undefined1 (*) [16])(pauVar14[1] + 0x30) = auVar32;
          pauVar14 = pauVar14 + 2;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
          iVar16 = iVar16 + 4;
        } while (iVar16 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar15);
        iVar16 = max_kk;
        do {
          *(undefined1 (*) [32])*pauVar14 = *pauVar18;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + lVar19 * 4);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar17 = uVar30 + 8;
      lVar20 = uVar30 + 0xf;
      lVar22 = lVar22 + 0x200;
      lVar26 = lVar26 + 0x100;
      lVar21 = lVar21 + 0x80;
      lVar15 = lVar15 + 0x20;
      uVar30 = uVar17;
    } while (lVar20 < lVar23);
  }
  if ((int)((uint)uVar17 | 3) < max_ii) {
    lVar20 = (long)(iVar2 * k);
    uVar30 = uVar17 & 0xffffffff;
    lVar15 = lVar28 + uVar30;
    lVar26 = lVar15 * 0x40 + lVar20 * 4 + 0xc0;
    lVar22 = lVar15 * 0x20 + lVar20 * 4 + 0x60;
    lVar21 = lVar15 * 0x10 + lVar20 * 4 + 0x30;
    lVar15 = lVar20 * 4 + lVar28 * 4 + uVar30 * 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar26);
        iVar16 = 0xf;
        do {
          auVar54 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar55 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
          auVar56 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
          auVar57 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
          auVar58 = vunpcklpd_avx512f(auVar54,auVar56);
          auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
          auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
          auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
          auVar57 = vshuff64x2_avx512f(auVar58,auVar54,0x88);
          auVar59 = vshuff64x2_avx512f(auVar56,auVar55,0x88);
          auVar54 = vshuff64x2_avx512f(auVar58,auVar54,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar56,auVar55,0xdd);
          auVar56 = vshuff64x2_avx512f(auVar57,auVar59,0x88);
          auVar58 = vshuff64x2_avx512f(auVar54,auVar55,0x88);
          auVar57 = vshuff64x2_avx512f(auVar57,auVar59,0xdd);
          auVar54 = vshuff64x2_avx512f(auVar54,auVar55,0xdd);
          *pauVar14 = auVar56;
          pauVar14[1] = auVar58;
          pauVar14[2] = auVar57;
          pauVar14[3] = auVar54;
          pauVar14 = pauVar14 + 4;
          iVar16 = iVar16 + 0x10;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar2 << 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar22);
        iVar16 = 7;
        do {
          auVar5 = vunpcklps_avx(pauVar18[-3],pauVar18[-2]);
          auVar6 = vunpckhps_avx(pauVar18[-3],pauVar18[-2]);
          auVar7 = vunpcklps_avx(pauVar18[-1],*pauVar18);
          auVar79 = vunpckhps_avx(pauVar18[-1],*pauVar18);
          auVar78 = vunpcklpd_avx(auVar5,auVar7);
          auVar5 = vunpckhpd_avx(auVar5,auVar7);
          auVar7 = vunpcklpd_avx(auVar6,auVar79);
          auVar6 = vunpckhpd_avx(auVar6,auVar79);
          auVar79._16_16_ = auVar5._0_16_;
          auVar79._0_16_ = auVar78._0_16_;
          auVar80._16_16_ = auVar6._0_16_;
          auVar80._0_16_ = auVar7._0_16_;
          auVar5 = vperm2f128_avx(auVar78,auVar5,0x31);
          auVar6 = vperm2f128_avx(auVar7,auVar6,0x31);
          *(undefined1 (*) [32])*pauVar14 = auVar79;
          *(undefined1 (*) [32])(*pauVar14 + 0x20) = auVar80;
          *(undefined1 (*) [32])pauVar14[1] = auVar5;
          *(undefined1 (*) [32])(pauVar14[1] + 0x20) = auVar6;
          pauVar14 = pauVar14 + 2;
          iVar16 = iVar16 + 8;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar2 * 8) * 4);
        } while (iVar16 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar21);
        iVar16 = 3;
        do {
          auVar3 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
          auVar36 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar4 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
          auVar31 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          auVar32 = vunpcklpd_avx(auVar3,auVar36);
          auVar3 = vunpckhpd_avx(auVar3,auVar36);
          auVar36 = vunpcklpd_avx(auVar4,auVar31);
          auVar4 = vunpckhpd_avx(auVar4,auVar31);
          *(undefined1 (*) [16])*pauVar14 = auVar32;
          *(undefined1 (*) [16])(*pauVar14 + 0x10) = auVar3;
          *(undefined1 (*) [16])(*pauVar14 + 0x20) = auVar36;
          *(undefined1 (*) [16])(*pauVar14 + 0x30) = auVar4;
          pauVar14 = pauVar14 + 1;
          iVar16 = iVar16 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar15);
        iVar16 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar14 = *pauVar25;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x10);
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar19 * 4);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar17 = uVar30 + 4;
      lVar20 = uVar30 + 7;
      lVar26 = lVar26 + 0x100;
      lVar22 = lVar22 + 0x80;
      lVar21 = lVar21 + 0x40;
      lVar15 = lVar15 + 0x10;
      uVar30 = uVar17;
    } while (lVar20 < lVar23);
  }
  if ((int)((uint)uVar17 | 1) < max_ii) {
    lVar20 = (long)(iVar2 * k);
    uVar30 = (ulong)(int)(uint)uVar17;
    lVar15 = uVar30 + lVar28;
    lVar21 = lVar15 * 0x40 + lVar20 * 4 + 0x40;
    lVar22 = lVar15 * 0x20 + lVar20 * 4 + 0x20;
    lVar15 = lVar15 * 0x10 + lVar20 * 4 + 0x10;
    lVar20 = lVar28 * 4 + uVar30 * 4 + lVar20 * 4 + 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar21);
        iVar16 = 0xf;
        do {
          auVar54 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
          auVar55 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
          auVar56 = vshuff64x2_avx512f(auVar54,auVar55,0x88);
          auVar54 = vshuff64x2_avx512f(auVar54,auVar55,0xdd);
          auVar55 = vshuff64x2_avx512f(auVar56,auVar54,0x88);
          auVar54 = vshuff64x2_avx512f(auVar56,auVar54,0xdd);
          *pauVar14 = auVar55;
          pauVar14[1] = auVar54;
          pauVar14 = pauVar14 + 2;
          iVar16 = iVar16 + 0x10;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar2 << 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar22);
        iVar16 = 7;
        do {
          auVar6 = vunpcklps_avx(pauVar18[-1],*pauVar18);
          auVar5 = vunpckhps_avx(pauVar18[-1],*pauVar18);
          auVar78._16_16_ = auVar5._0_16_;
          auVar78._0_16_ = auVar6._0_16_;
          auVar5 = vperm2f128_avx(auVar6,auVar5,0x31);
          *(undefined1 (*) [32])*pauVar14 = auVar78;
          *(undefined1 (*) [32])(*pauVar14 + 0x20) = auVar5;
          pauVar14 = pauVar14 + 1;
          iVar16 = iVar16 + 8;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar2 * 8) * 4);
        } while (iVar16 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar15);
        iVar16 = 3;
        do {
          auVar4 = vunpcklps_avx(pauVar25[-1],*pauVar25);
          auVar3 = vunpckhps_avx(pauVar25[-1],*pauVar25);
          *(undefined1 (*) [16])*pauVar14 = auVar4;
          *(undefined1 (*) [16])(*pauVar14 + 0x10) = auVar3;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
          iVar16 = iVar16 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar27 = (undefined4 *)((long)A->data + lVar20);
        iVar16 = max_kk;
        do {
          *(undefined4 *)*pauVar14 = puVar27[-1];
          *(undefined4 *)(*pauVar14 + 4) = *puVar27;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 8);
          puVar27 = puVar27 + lVar19;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar17 = uVar30 + 2;
      lVar26 = uVar30 + 3;
      lVar21 = lVar21 + 0x80;
      lVar22 = lVar22 + 0x40;
      lVar15 = lVar15 + 0x20;
      lVar20 = lVar20 + 8;
      uVar30 = uVar17;
    } while (lVar26 < lVar23);
  }
  if ((int)uVar17 < max_ii) {
    lVar22 = (long)(k * iVar2);
    lVar26 = (long)(int)uVar17;
    lVar15 = lVar26 + lVar28;
    lVar20 = lVar15 * 0x40 + lVar22 * 4;
    lVar21 = lVar15 * 0x20 + lVar22 * 4;
    lVar15 = lVar15 * 0x10 + lVar22 * 4;
    lVar28 = lVar28 * 4 + lVar26 * 4 + lVar22 * 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar24 = (undefined1 (*) [64])((long)A->data + lVar20);
        iVar16 = 0xf;
        do {
          *pauVar14 = *pauVar24;
          pauVar14 = pauVar14 + 1;
          iVar16 = iVar16 + 0x10;
          pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar2 << 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar18 = (undefined1 (*) [32])((long)A->data + lVar21);
        iVar16 = 7;
        do {
          *(undefined1 (*) [32])*pauVar14 = *pauVar18;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
          iVar16 = iVar16 + 8;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar2 * 8) * 4);
        } while (iVar16 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [16])((long)A->data + lVar15);
        iVar16 = 3;
        do {
          *(undefined1 (*) [16])*pauVar14 = *pauVar25;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x10);
          iVar16 = iVar16 + 4;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)(iVar2 * 4) * 4);
        } while (iVar16 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar27 = (undefined4 *)((long)A->data + lVar28);
        iVar16 = max_kk;
        do {
          *(undefined4 *)*pauVar14 = *puVar27;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 4);
          puVar27 = puVar27 + lVar19;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      lVar26 = lVar26 + 1;
      lVar20 = lVar20 + 0x40;
      lVar21 = lVar21 + 0x20;
      lVar15 = lVar15 + 0x10;
      lVar28 = lVar28 + 4;
    } while (lVar26 != lVar23);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}